

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::FixForeignFieldsInDescriptors(Generator *this)

{
  Printer *this_00;
  FileDescriptor *pFVar1;
  long lVar2;
  long lVar3;
  string local_40;
  
  pFVar1 = this->file_;
  if (0 < *(int *)(pFVar1 + 0x58)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      FixForeignFieldsInDescriptor
                (this,(Descriptor *)(*(long *)(pFVar1 + 0x60) + lVar2),(Descriptor *)0x0);
      lVar3 = lVar3 + 1;
      pFVar1 = this->file_;
      lVar2 = lVar2 + 0xa8;
    } while (lVar3 < *(int *)(pFVar1 + 0x58));
  }
  pFVar1 = this->file_;
  if (0 < *(int *)(pFVar1 + 0x58)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      AddMessageToFileDescriptor(this,(Descriptor *)(*(long *)(pFVar1 + 0x60) + lVar2));
      lVar3 = lVar3 + 1;
      pFVar1 = this->file_;
      lVar2 = lVar2 + 0xa8;
    } while (lVar3 < *(int *)(pFVar1 + 0x58));
  }
  pFVar1 = this->file_;
  if (0 < *(int *)(pFVar1 + 0x68)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      AddEnumToFileDescriptor(this,(EnumDescriptor *)(*(long *)(pFVar1 + 0x70) + lVar2));
      lVar3 = lVar3 + 1;
      pFVar1 = this->file_;
      lVar2 = lVar2 + 0x38;
    } while (lVar3 < *(int *)(pFVar1 + 0x68));
  }
  pFVar1 = this->file_;
  if (0 < *(int *)(pFVar1 + 0x88)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      AddExtensionToFileDescriptor(this,(FieldDescriptor *)(*(long *)(pFVar1 + 0x98) + lVar2));
      lVar3 = lVar3 + 1;
      pFVar1 = this->file_;
      lVar2 = lVar2 + 0xa8;
    } while (lVar3 < *(int *)(pFVar1 + 0x88));
  }
  this_00 = this->printer_;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"DESCRIPTOR","");
  io::Printer::Print(this_00,"_sym_db.RegisterFileDescriptor($name$)\n","name",&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Print(this->printer_,"\n");
  return;
}

Assistant:

void Generator::FixForeignFieldsInDescriptors() const {
  for (int i = 0; i < file_->message_type_count(); ++i) {
    FixForeignFieldsInDescriptor(*file_->message_type(i), NULL);
  }
  for (int i = 0; i < file_->message_type_count(); ++i) {
    AddMessageToFileDescriptor(*file_->message_type(i));
  }
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    AddEnumToFileDescriptor(*file_->enum_type(i));
  }
  for (int i = 0; i < file_->extension_count(); ++i) {
    AddExtensionToFileDescriptor(*file_->extension(i));
  }
  // TODO(jieluo): Move this register to PrintFileDescriptor() when
  // FieldDescriptor.file is added in generated file.
  printer_->Print("_sym_db.RegisterFileDescriptor($name$)\n", "name",
                  kDescriptorKey);
  printer_->Print("\n");
}